

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed-dtoa.cc
# Opt level: O0

void __thiscall double_conversion::UInt128::Shift(UInt128 *this,int shift_amount)

{
  byte bVar1;
  int shift_amount_local;
  UInt128 *this_local;
  
  if (shift_amount != 0) {
    if (shift_amount == -0x40) {
      this->high_bits_ = this->low_bits_;
      this->low_bits_ = 0;
    }
    else if (shift_amount == 0x40) {
      this->low_bits_ = this->high_bits_;
      this->high_bits_ = 0;
    }
    else {
      bVar1 = (byte)shift_amount;
      if (shift_amount < 1) {
        this->high_bits_ = this->high_bits_ << (-bVar1 & 0x3f);
        this->high_bits_ = (this->low_bits_ >> (bVar1 + 0x40 & 0x3f)) + this->high_bits_;
        this->low_bits_ = this->low_bits_ << (-bVar1 & 0x3f);
      }
      else {
        this->low_bits_ = this->low_bits_ >> (bVar1 & 0x3f);
        this->low_bits_ = (this->high_bits_ << (0x40 - bVar1 & 0x3f)) + this->low_bits_;
        this->high_bits_ = this->high_bits_ >> (bVar1 & 0x3f);
      }
    }
  }
  return;
}

Assistant:

void Shift(int shift_amount) {
    DOUBLE_CONVERSION_ASSERT(-64 <= shift_amount && shift_amount <= 64);
    if (shift_amount == 0) {
      return;
    } else if (shift_amount == -64) {
      high_bits_ = low_bits_;
      low_bits_ = 0;
    } else if (shift_amount == 64) {
      low_bits_ = high_bits_;
      high_bits_ = 0;
    } else if (shift_amount <= 0) {
      high_bits_ <<= -shift_amount;
      high_bits_ += low_bits_ >> (64 + shift_amount);
      low_bits_ <<= -shift_amount;
    } else {
      low_bits_ >>= shift_amount;
      low_bits_ += high_bits_ << (64 - shift_amount);
      high_bits_ >>= shift_amount;
    }
  }